

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void makestartposgood(void)

{
  uint uVar1;
  uint uVar2;
  int len;
  int curs;
  int pos;
  int n;
  
  uVar1 = (uint)CmdLine[0x103];
  uVar2 = (uint)CmdLine[1];
  curs = uVar1;
  if (CmdLine[0] <= uVar1) {
    curs = (uVar2 - ConCols) + 2;
  }
  if (ConCols + -2 <= (int)(uVar2 - uVar1)) {
    curs = (uVar2 - ConCols) + 2;
  }
  if (uVar2 < uVar1) {
    curs = uVar2;
  }
  if (curs < 0) {
    curs = 0;
  }
  CmdLine[0x103] = (BYTE)curs;
  return;
}

Assistant:

static void makestartposgood ()
{
	int n;
	int pos = CmdLine[259];
	int curs = CmdLine[1];
	int len = CmdLine[0];

	n = pos;

	if (pos >= len)
	{ // Start of visible line is beyond end of line
		n = curs - ConCols + 2;
	}
	if ((curs - pos) >= ConCols - 2)
	{ // The cursor is beyond the visible part of the line
		n = curs - ConCols + 2;
	}
	if (pos > curs)
	{ // The cursor is in front of the visible part of the line
		n = curs;
	}
	if (n < 0)
		n = 0;
	CmdLine[259] = n;
}